

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

int BN_STACK_push(BN_STACK *st,uint idx)

{
  uint uVar1;
  char *func;
  int in_ESI;
  long *in_RDI;
  uint *newitems;
  uint newsize;
  uint local_24;
  
  if ((int)in_RDI[1] == *(int *)((long)in_RDI + 0xc)) {
    if (*(int *)((long)in_RDI + 0xc) == 0) {
      local_24 = 0x20;
    }
    else {
      local_24 = (uint)(*(int *)((long)in_RDI + 0xc) * 3) >> 1;
    }
    func = (char *)CRYPTO_malloc(local_24 << 2,"crypto/bn/bn_ctx.c",0x10f);
    if (func == (char *)0x0) {
      ERR_new();
      ERR_set_debug((char *)in_RDI,in_ESI,func);
      ERR_set_error(3,0xc0100,(char *)0x0);
      return 0;
    }
    if ((int)in_RDI[1] != 0) {
      memcpy(func,(void *)*in_RDI,(ulong)*(uint *)(in_RDI + 1) << 2);
    }
    CRYPTO_free((void *)*in_RDI);
    *in_RDI = (long)func;
    *(uint *)((long)in_RDI + 0xc) = local_24;
  }
  uVar1 = *(uint *)(in_RDI + 1);
  *(uint *)(in_RDI + 1) = uVar1 + 1;
  *(int *)(*in_RDI + (ulong)uVar1 * 4) = in_ESI;
  return 1;
}

Assistant:

static int BN_STACK_push(BN_STACK *st, unsigned int idx)
{
    if (st->depth == st->size) {
        /* Need to expand */
        unsigned int newsize =
            st->size ? (st->size * 3 / 2) : BN_CTX_START_FRAMES;
        unsigned int *newitems;

        if ((newitems = OPENSSL_malloc(sizeof(*newitems) * newsize)) == NULL) {
            ERR_raise(ERR_LIB_BN, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        if (st->depth)
            memcpy(newitems, st->indexes, sizeof(*newitems) * st->depth);
        OPENSSL_free(st->indexes);
        st->indexes = newitems;
        st->size = newsize;
    }
    st->indexes[(st->depth)++] = idx;
    return 1;
}